

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_ManSimClassRefineOne(Gia_Man_t *p,int iRepr)

{
  int iVar1;
  int local_24;
  int local_20;
  int iRepr2;
  int iPrev2;
  int iPrev;
  int iObj;
  int iRepr_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsHead(p,iRepr);
  if (iVar1 != 0) {
    local_24 = Gia_ObjNext(p,iRepr);
    iRepr2 = iRepr;
    while ((0 < local_24 && (iVar1 = Cec2_ObjSimEqual(p,iRepr,local_24), iVar1 != 0))) {
      iRepr2 = local_24;
      local_24 = Gia_ObjNext(p,local_24);
    }
    if (0 < local_24) {
      Gia_ObjSetRepr(p,local_24,0xfffffff);
      local_20 = local_24;
      for (iPrev2 = Gia_ObjNext(p,local_24); 0 < iPrev2; iPrev2 = Gia_ObjNext(p,iPrev2)) {
        iVar1 = Cec2_ObjSimEqual(p,iRepr,iPrev2);
        if (iVar1 == 0) {
          Gia_ObjSetRepr(p,iPrev2,local_24);
          Gia_ObjSetNext(p,local_20,iPrev2);
          local_20 = iPrev2;
        }
        else {
          Gia_ObjSetNext(p,iRepr2,iPrev2);
          iRepr2 = iPrev2;
        }
      }
      Gia_ObjSetNext(p,iRepr2,-1);
      Gia_ObjSetNext(p,local_20,-1);
    }
    return;
  }
  __assert_fail("Gia_ObjIsHead(p, iRepr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                ,0x251,"void Cec2_ManSimClassRefineOne(Gia_Man_t *, int)");
}

Assistant:

void Cec2_ManSimClassRefineOne( Gia_Man_t * p, int iRepr )
{
    int iObj, iPrev = iRepr, iPrev2, iRepr2;
    Gia_ClassForEachObj1( p, iRepr, iRepr2 )
        if ( Cec2_ObjSimEqual(p, iRepr, iRepr2) )
            iPrev = iRepr2;
        else
            break;
    if ( iRepr2 <= 0 ) // no refinement
        return;
    // relink remaining nodes of the class
    // nodes that are equal to iRepr, remain in the class of iRepr
    // nodes that are not equal to iRepr, move to the class of iRepr2
    Gia_ObjSetRepr( p, iRepr2, GIA_VOID );
    iPrev2 = iRepr2;
    for ( iObj = Gia_ObjNext(p, iRepr2); iObj > 0; iObj = Gia_ObjNext(p, iObj) )
    {
        if ( Cec2_ObjSimEqual(p, iRepr, iObj) ) // remains with iRepr
        {
            Gia_ObjSetNext( p, iPrev, iObj );
            iPrev = iObj;
        }
        else // moves to iRepr2
        {
            Gia_ObjSetRepr( p, iObj, iRepr2 );
            Gia_ObjSetNext( p, iPrev2, iObj );
            iPrev2 = iObj;
        }
    }
    Gia_ObjSetNext( p, iPrev, -1 );
    Gia_ObjSetNext( p, iPrev2, -1 );
}